

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCollapse.c
# Opt level: O0

Vec_Str_t *
Abc_NtkClpGiaOne(Gia_Man_t *p,int iCo,int nCubeLim,int nBTLimit,int fCanon,int fReverse,
                Vec_Int_t *vSupp,int fVerbose,Vec_Int_t *vClass,Vec_Wec_t *vSupps)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Gia_Man_t *p_00;
  Gia_Man_t *vSop_00;
  abctime aVar6;
  Gia_Man_t *pGia;
  abctime clk;
  Vec_Str_t *vSop;
  int fReverse_local;
  int fCanon_local;
  int nBTLimit_local;
  int nCubeLim_local;
  int iCo_local;
  Gia_Man_t *p_local;
  
  nBTLimit_local = iCo;
  _nCubeLim_local = p;
  aVar5 = Abc_Clock();
  p_00 = Gia_ManDupCones(_nCubeLim_local,&nBTLimit_local,1,1);
  iVar3 = nBTLimit_local;
  if (fVerbose != 0) {
    uVar1 = Vec_IntSize(vSupp);
    uVar2 = Gia_ManAndNum(p_00);
    printf("Output %4d:  Supp = %4d. Cone =%6d.\n",(ulong)(uint)iVar3,(ulong)uVar1,(ulong)uVar2);
  }
  vSop_00 = (Gia_Man_t *)Bmc_CollapseOneOld(p_00,nCubeLim,nBTLimit,fCanon,fReverse,fVerbose);
  Gia_ManStop(p_00);
  if (vSop_00 == (Gia_Man_t *)0x0) {
    p_local = (Gia_Man_t *)0x0;
  }
  else {
    Abc_NtkCollapseReduce((Vec_Str_t *)vSop_00,vSupp,vClass,vSupps);
    p_local = vSop_00;
    if (fVerbose != 0) {
      uVar1 = Vec_IntSize(vSupp);
      iVar3 = Vec_StrSize((Vec_Str_t *)vSop_00);
      iVar4 = Vec_IntSize(vSupp);
      printf("Supp new = %4d. Sop = %4d.  ",(ulong)uVar1,
             (long)iVar3 / (long)(iVar4 + 3) & 0xffffffff);
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar6 - aVar5);
    }
  }
  return (Vec_Str_t *)p_local;
}

Assistant:

Vec_Str_t * Abc_NtkClpGiaOne( Gia_Man_t * p, int iCo, int nCubeLim, int nBTLimit, int fCanon, int fReverse, Vec_Int_t * vSupp, int fVerbose, Vec_Int_t * vClass, Vec_Wec_t * vSupps )
{
    Vec_Str_t * vSop;
    abctime clk = Abc_Clock();
    extern Vec_Str_t * Bmc_CollapseOneOld( Gia_Man_t * p, int nCubeLim, int nBTLimit, int fCanon, int fReverse, int fVerbose );
    Gia_Man_t * pGia  = Gia_ManDupCones( p, &iCo, 1, 1 );
    if ( fVerbose )
        printf( "Output %4d:  Supp = %4d. Cone =%6d.\n", iCo, Vec_IntSize(vSupp), Gia_ManAndNum(pGia) );
    vSop = Bmc_CollapseOneOld( pGia, nCubeLim, nBTLimit, fCanon, fReverse, fVerbose );
    Gia_ManStop( pGia );
    if ( vSop == NULL )
        return NULL;
    Abc_NtkCollapseReduce( vSop, vSupp, vClass, vSupps );
    if ( fVerbose )
        printf( "Supp new = %4d. Sop = %4d.  ", Vec_IntSize(vSupp), Vec_StrSize(vSop)/(Vec_IntSize(vSupp) +3) );
    if ( fVerbose )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    return vSop; 
}